

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  ValueHolder *pVVar1;
  bool bVar2;
  ValueHolder VVar3;
  _Elt_pointer ppVVar4;
  string decoded;
  string local_48;
  ValueHolder local_28;
  ushort local_20;
  undefined4 extraout_var;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  bVar2 = decodeString(this,token,&local_48);
  if (bVar2) {
    valueAllocator();
    VVar3._0_4_ = (*valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                            (valueAllocator::valueAllocator,local_48._M_dataplus._M_p,
                             local_48._M_string_length & 0xffffffff);
    VVar3._4_4_ = extraout_var;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar4 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar1 = &ppVVar4[-1]->value_;
    local_28 = *pVVar1;
    *pVVar1 = VVar3;
    local_20 = *(ushort *)(pVVar1 + 1);
    *(ushort *)(pVVar1 + 1) = local_20 & 0xfe00 | 0x104;
    local_20 = local_20 & 0x1ff;
    Value::~Value((Value *)&local_28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool
Reader::decodeString ( Token& token )
{
    std::string decoded;

    if ( !decodeString ( token, decoded ) )
        return false;

    currentValue () = decoded;
    return true;
}